

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.hpp
# Opt level: O0

void __thiscall
Lodtalk::MethodDictionary::internalAtPut
          (MethodDictionary *this,VMContext *context,Oop key,Oop value)

{
  anon_union_8_4_0eb573b0_for_Oop_0 obj;
  bool bVar1;
  ptrdiff_t pVar2;
  Oop *pOVar3;
  Oop *pOVar4;
  Oop oldKey;
  Oop *valueArray;
  Oop *keyArray;
  anon_union_8_4_0eb573b0_for_Oop_0 local_78;
  OopRef valueRef;
  OopRef keyRef;
  ptrdiff_t position;
  VMContext *context_local;
  MethodDictionary *this_local;
  Oop value_local;
  Oop key_local;
  
  this_local = (MethodDictionary *)value.field_0;
  value_local = key;
  pVar2 = HashedCollection::
          findKeyPosition<Lodtalk::Oop(Lodtalk::Oop_const&),int(Lodtalk::Oop),bool(Lodtalk::Oop,Lodtalk::Oop)>
                    ((HashedCollection *)this,key,identityFunction<Lodtalk::Oop>,identityHashOf,
                     identityOopEquals);
  if (pVar2 < 0) {
    OopRef::OopRef((OopRef *)&valueRef.nextReference_,context,&value_local);
    OopRef::OopRef((OopRef *)&local_78,context,(Oop *)&this_local);
    increaseCapacity(this,context);
    internalAtPut(this,context,(Oop)valueRef.nextReference_,(Oop)local_78);
    OopRef::~OopRef((OopRef *)&local_78);
    OopRef::~OopRef((OopRef *)&valueRef.nextReference_);
  }
  else {
    pOVar3 = getHashTableKeys(this);
    pOVar4 = getHashTableValues(this);
    obj = pOVar3[pVar2].field_0;
    pOVar3[pVar2].field_0 = value_local.field_0;
    pOVar4[pVar2].field_0.header = (ObjectHeader *)this_local;
    bVar1 = isNil((Oop)obj);
    if (bVar1) {
      increaseSize(this,context);
    }
  }
  return;
}

Assistant:

void internalAtPut(VMContext *context, Oop key, Oop value)
	{
		// If a slot was not found, try to increase the capacity.
		auto position = findKeyPosition(key, identityFunction<Oop>, identityHashOf, identityOopEquals);
		if(position < 0)
		{
            OopRef keyRef(context, key);
            OopRef valueRef(context, value);
			increaseCapacity(context);
            return internalAtPut(context, keyRef.oop, valueRef.oop);
		}

		// Put the key and value.
		auto keyArray = getHashTableKeys();
		auto valueArray = getHashTableValues();
		auto oldKey = keyArray[position];
		keyArray[position] = key;
		valueArray[position] = value;

		// Increase the size.
		if(isNil(oldKey))
			increaseSize(context);
	}